

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_arith_modw(DisasContext_conflict10 *ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2,
                      int sign)

{
  TCGTemp *pTVar1;
  TCGTemp *ts;
  TCGv_i32 pTVar2;
  uintptr_t o_1;
  TCGv_i32 pTVar3;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i32 ret_00;
  uintptr_t o_3;
  TCGv_i32 ret_01;
  
  pTVar1 = tcg_temp_new_internal_ppc64((TCGContext_conflict10 *)ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar1 - (long)ctx);
  pTVar1 = tcg_temp_new_internal_ppc64((TCGContext_conflict10 *)ctx,TCG_TYPE_I32,false);
  ret_01 = (TCGv_i32)((long)pTVar1 - (long)ctx);
  tcg_gen_extrl_i64_i32_ppc64((TCGContext_conflict10 *)ctx,ret_00,arg1);
  tcg_gen_extrl_i64_i32_ppc64((TCGContext_conflict10 *)ctx,ret_01,arg2);
  if (sign == 0) {
    pTVar2 = tcg_const_i32_ppc64((TCGContext_conflict10 *)ctx,1);
    pTVar3 = tcg_const_i32_ppc64((TCGContext_conflict10 *)ctx,0);
    tcg_gen_movcond_i32_ppc64
              ((TCGContext_conflict10 *)ctx,TCG_COND_EQ,ret_01,ret_01,pTVar3,pTVar2,ret_01);
    tcg_gen_remu_i32_ppc64((TCGContext_conflict10 *)ctx,pTVar3,ret_00,ret_01);
    tcg_gen_extu_i32_i64_ppc64((TCGContext_conflict10 *)ctx,ret,pTVar3);
    tcg_temp_free_internal_ppc64((TCGContext_conflict10 *)ctx,(TCGTemp *)(pTVar2 + (long)ctx));
    pTVar1 = (TCGTemp *)(pTVar3 + (long)ctx);
  }
  else {
    ts = tcg_temp_new_internal_ppc64((TCGContext_conflict10 *)ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)ts - (long)ctx);
    pTVar1 = tcg_temp_new_internal_ppc64((TCGContext_conflict10 *)ctx,TCG_TYPE_I32,false);
    pTVar2 = (TCGv_i32)((long)pTVar1 - (long)ctx);
    tcg_gen_setcondi_i32_ppc64((TCGContext_conflict10 *)ctx,TCG_COND_EQ,pTVar3,ret_00,-0x80000000);
    tcg_gen_setcondi_i32_ppc64((TCGContext_conflict10 *)ctx,TCG_COND_EQ,pTVar2,ret_01,-1);
    tcg_gen_op3_ppc64((TCGContext_conflict10 *)ctx,INDEX_op_and_i32,(TCGArg)ts,(TCGArg)ts,
                      (TCGArg)pTVar1);
    tcg_gen_setcondi_i32_ppc64((TCGContext_conflict10 *)ctx,TCG_COND_EQ,pTVar2,ret_01,0);
    tcg_gen_op3_ppc64((TCGContext_conflict10 *)ctx,INDEX_op_or_i32,(TCGArg)ts,(TCGArg)ts,
                      (TCGArg)pTVar1);
    tcg_gen_op2_ppc64((TCGContext_conflict10 *)ctx,INDEX_op_movi_i32,(TCGArg)pTVar1,0);
    tcg_gen_movcond_i32_ppc64
              ((TCGContext_conflict10 *)ctx,TCG_COND_NE,ret_01,pTVar3,pTVar2,pTVar3,ret_01);
    tcg_gen_rem_i32_ppc64((TCGContext_conflict10 *)ctx,pTVar2,ret_00,ret_01);
    tcg_gen_ext_i32_i64_ppc64((TCGContext_conflict10 *)ctx,ret,pTVar2);
    tcg_temp_free_internal_ppc64((TCGContext_conflict10 *)ctx,ts);
  }
  tcg_temp_free_internal_ppc64((TCGContext_conflict10 *)ctx,pTVar1);
  tcg_temp_free_internal_ppc64((TCGContext_conflict10 *)ctx,(TCGTemp *)(ret_00 + (long)ctx));
  tcg_temp_free_internal_ppc64((TCGContext_conflict10 *)ctx,(TCGTemp *)(ret_01 + (long)ctx));
  return;
}

Assistant:

static inline void gen_op_arith_modw(DisasContext *ctx, TCGv ret, TCGv arg1,
                                     TCGv arg2, int sign)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, arg1);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, arg2);
    if (sign) {
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
        tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
        tcg_gen_and_i32(tcg_ctx, t2, t2, t3);
        tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
        tcg_gen_or_i32(tcg_ctx, t2, t2, t3);
        tcg_gen_movi_i32(tcg_ctx, t3, 0);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
        tcg_gen_rem_i32(tcg_ctx, t3, t0, t1);
        tcg_gen_ext_i32_tl(tcg_ctx, ret, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    } else {
        TCGv_i32 t2 = tcg_const_i32(tcg_ctx, 1);
        TCGv_i32 t3 = tcg_const_i32(tcg_ctx, 0);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, t1, t1, t3, t2, t1);
        tcg_gen_remu_i32(tcg_ctx, t3, t0, t1);
        tcg_gen_extu_i32_tl(tcg_ctx, ret, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
}